

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

void __thiscall
docopt::Option::Option(Option *this,string *shortOption,string *longOption,int argcount,value *v)

{
  bool bVar1;
  string *psVar2;
  value local_b0;
  value local_88;
  string local_60;
  value *local_40;
  int local_34;
  
  psVar2 = longOption;
  if (longOption->_M_string_length == 0) {
    psVar2 = shortOption;
  }
  local_34 = argcount;
  std::__cxx11::string::string((string *)&local_60,(string *)psVar2);
  local_40 = v;
  value::value(&local_b0,v);
  LeafPattern::LeafPattern(&this->super_LeafPattern,&local_60,&local_b0);
  value::~value(&local_b0);
  std::__cxx11::string::~string((string *)&local_60);
  (this->super_LeafPattern).super_Pattern._vptr_Pattern = (_func_int **)&PTR_flat_001c2420;
  std::__cxx11::string::string((string *)&this->fShortOption,(string *)shortOption);
  std::__cxx11::string::string((string *)&this->fLongOption,(string *)longOption);
  this->fArgcount = local_34;
  if ((local_34 != 0) && (local_40->kind == Bool)) {
    bVar1 = value::asBool(local_40);
    if (!bVar1) {
      local_88.kind = Empty;
      value::operator=(&(this->super_LeafPattern).fValue,&local_88);
      value::~value(&local_88);
    }
  }
  return;
}

Assistant:

Option(std::string shortOption,
		       std::string longOption,
		       int argcount = 0,
		       value v = value{false})
		: LeafPattern(longOption.empty() ? shortOption : longOption,
			      std::move(v)),
		  fShortOption(std::move(shortOption)),
		  fLongOption(std::move(longOption)),
		  fArgcount(argcount)
		{
			// From Python:
			//   self.value = None if value is False and argcount else value
			if (argcount && v.isBool() && !v.asBool()) {
				setValue(value{});
			}
		}